

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::next(LinePartIterator *this)

{
  int iVar1;
  LinePartIterator *this_local;
  
  if (this->ptr == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->col == -1) {
    this->col = 0;
    update_length(this);
    this_local._7_1_ = true;
  }
  else {
    this->ptr = this->ptr + this->len;
LAB_0021947c:
    do {
      switch(*this->ptr) {
      case '\0':
      case '\n':
        if ((this->hit_target_line & 1U) == 0) {
          update_length(this);
          this->hit_target_line = true;
          return true;
        }
        iVar1 = this->target_line_in_block + 1;
        this->target_line_in_block = iVar1;
        if (this->max_line_in_block < iVar1) {
          update_length(this);
          return false;
        }
        this->hit_target_line = false;
        this->line_in_block = 0;
        this->col = 0;
        this->ptr = this->rowstart;
        goto LAB_0021947c;
      default:
        this->ptr = this->ptr + 1;
        goto LAB_0021947c;
      case '\t':
        if ((this->hit_target_line & 1U) == 0) {
          update_length(this);
          this->hit_target_line = true;
          return true;
        }
        this->hit_target_line = false;
        this->line_in_block = 0;
        this->col = this->col + 1;
        this->ptr = this->ptr + 1;
        break;
      case '\v':
        iVar1 = this->line_in_block + 1;
        this->line_in_block = iVar1;
        upmax(&this->max_line_in_block,iVar1);
        this->ptr = this->ptr + 1;
      }
    } while (this->line_in_block != this->target_line_in_block);
    update_length(this);
    this->hit_target_line = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool next() {
			if (ptr == 0)
				return false;

			if (col == -1) {
				col = 0;
				update_length();
				return true;
			}

			ptr += len;
			while (true) {
				switch (*ptr) {
				case '\v':
					upmax(max_line_in_block, ++line_in_block);
					++ptr;
					break;
				case '\t':
					if (!hit_target_line) // if previous column did not have the targetline
					{   // then "insert" a 0-length part
						update_length();
						hit_target_line = true;
						return true;
					}

					hit_target_line = false;
					line_in_block = 0;
					++col;
					++ptr;
					break;
				case 0:
				case '\n':
					if (!hit_target_line) // if previous column did not have the targetline
					{   // then "insert" a 0-length part
						update_length();
						hit_target_line = true;
						return true;
					}

					if (++target_line_in_block > max_line_in_block) {
						update_length();
						return false;
					}

					hit_target_line = false;
					line_in_block = 0;
					col = 0;
					ptr = rowstart;
					continue;
				default:
					++ptr;
					continue;
				} // switch

				if (line_in_block == target_line_in_block) {
					update_length();
					hit_target_line = true;
					return true;
				}
			} // while
		}